

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O2

void __thiscall
Reflection::StructImpl<Analyser::Static::AppleII::Target>::declare_emplace<bool>
          (StructImpl<Analyser::Static::AppleII::Target> *this,bool *t,string *name,size_t count)

{
  string asStack_58 [32];
  undefined *local_38;
  long local_30;
  undefined8 local_28;
  size_t local_20;
  
  std::__cxx11::string::string(asStack_58,(string *)name);
  local_38 = &bool::typeinfo;
  local_28 = 1;
  local_30 = (long)t - (long)this;
  local_20 = count;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Reflection::StructImpl<Analyser::Static::AppleII::Target>::Field>,std::allocator<std::pair<std::__cxx11::string_const,Reflection::StructImpl<Analyser::Static::AppleII::Target>::Field>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string,Reflection::StructImpl<Analyser::Static::AppleII::Target>::Field>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Reflection::StructImpl<Analyser::Static::AppleII::Target>::Field>,std::allocator<std::pair<std::__cxx11::string_const,Reflection::StructImpl<Analyser::Static::AppleII::Target>::Field>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&contents__abi_cxx11_,asStack_58);
  std::__cxx11::string::~string(asStack_58);
  return;
}

Assistant:

void declare_emplace(Type *t, const std::string &name, size_t count = 1) {
			contents_.emplace(
				std::make_pair(
					name,
					Field(typeid(Type), reinterpret_cast<uint8_t *>(t) - reinterpret_cast<uint8_t *>(this), sizeof(Type), count)
				));
		}